

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

InlineRep * __thiscall
absl::lts_20250127::Cord::InlineRep::operator=(InlineRep *this,InlineRep *src)

{
  bool bVar1;
  InlineRep *src_local;
  InlineRep *this_local;
  
  if (this != src) {
    bVar1 = is_tree(this);
    if ((bVar1) || (bVar1 = is_tree(src), bVar1)) {
      AssignSlow(this,src);
    }
    else {
      cord_internal::InlineData::operator=(&this->data_,&src->data_);
    }
  }
  return this;
}

Assistant:

inline Cord::InlineRep& Cord::InlineRep::operator=(const Cord::InlineRep& src) {
  if (this == &src) {
    return *this;
  }
  if (!is_tree() && !src.is_tree()) {
    data_ = src.data_;
    return *this;
  }
  AssignSlow(src);
  return *this;
}